

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.cpp
# Opt level: O1

void M_Drawer(void)

{
  FFont *this;
  int iVar1;
  int iVar2;
  long lVar3;
  undefined8 *puVar4;
  BYTE *string;
  long lVar5;
  uint uVar6;
  
  lVar3 = (long)consoleplayer;
  lVar5 = (&DAT_00a39408)[lVar3 * 0x54];
  if ((lVar5 != 0) && ((*(byte *)(lVar5 + 0x20) & 0x20) != 0)) {
    (&DAT_00a39408)[lVar3 * 0x54] = 0;
    lVar5 = 0;
  }
  uVar6 = 0;
  if ((lVar5 != 0) && (uVar6 = 0, screen->Accel2D == false)) {
    if ((gamestate == GS_TITLELEVEL) || (gamestate == GS_LEVEL)) {
      puVar4 = &players + lVar3 * 0x54;
      if (*(undefined8 **)(lVar5 + 0x200) != (undefined8 *)0x0) {
        puVar4 = *(undefined8 **)(lVar5 + 0x200);
      }
      uVar6 = (int)(*(float *)(puVar4 + 0x35) * 255.0) & 0xffU |
              ((int)(*(float *)((long)puVar4 + 0x1a4) * 255.0) & 0xffU) << 8 |
              ((int)(*(float *)(puVar4 + 0x34) * 255.0) & 0xffU) << 0x10 |
              (int)(*(float *)((long)puVar4 + 0x1ac) * 255.0) << 0x18;
    }
  }
  if ((DMenu::CurrentMenu != (DMenu *)0x0) && (menuactive != MENU_Off)) {
    iVar1 = (*(DMenu::CurrentMenu->super_DObject)._vptr_DObject[0xb])();
    if ((char)iVar1 != '\0') {
      (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xd])
                (screen,(ulong)uVar6);
    }
    (*(DMenu::CurrentMenu->super_DObject)._vptr_DObject[10])();
  }
  if ((show_outdated_iwad_warning == true) && (DrawOutdatedIWADWarning()::needDisplay == '\0')) {
    uVar6 = I_MSTime();
    if (DrawOutdatedIWADWarning()::startTime == '\0') {
      M_Drawer();
    }
    this = SmallFont;
    if ((int)(uVar6 - DrawOutdatedIWADWarning()::startTime) < 10000) {
      string = (BYTE *)FStringTable::operator()(&GStrings,"MNU_OUTDATED_IWAD");
      iVar1 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
      iVar2 = FFont::StringWidth(this,string);
      DCanvas::DrawText((DCanvas *)screen,this,(uint)(499 < (int)uVar6 % 1000) * 3 + 6,
                        (iVar1 - iVar2 * CleanXfac) / 2,this->FontHeight,(char *)string,0x40001393,1
                        ,0);
    }
    else {
      DrawOutdatedIWADWarning()::needDisplay = '\x01';
    }
  }
  return;
}

Assistant:

void M_Drawer (void) 
{
	player_t *player = &players[consoleplayer];
	AActor *camera = player->camera;
	PalEntry fade = 0;

	if (!screen->Accel2D && camera != NULL && (gamestate == GS_LEVEL || gamestate == GS_TITLELEVEL))
	{
		if (camera->player != NULL)
		{
			player = camera->player;
		}
		fade = PalEntry (BYTE(player->BlendA*255), BYTE(player->BlendR*255), BYTE(player->BlendG*255), BYTE(player->BlendB*255));
	}


	if (DMenu::CurrentMenu != NULL && menuactive != MENU_Off) 
	{
		if (DMenu::CurrentMenu->DimAllowed()) screen->Dim(fade);
		DMenu::CurrentMenu->Drawer();
	}

	DrawOutdatedIWADWarning();
}